

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SwapChainGLImpl::SwapChainGLImpl
          (SwapChainGLImpl *this,IReferenceCounters *pRefCounters,EngineGLCreateInfo *InitAttribs,
          SwapChainDesc *SCDesc,RenderDeviceGLImpl *pRenderDeviceGL,
          DeviceContextGLImpl *pImmediateContextGL)

{
  undefined *puVar1;
  TEXTURE_FORMAT Format;
  GLDeviceCaps *pGVar2;
  TextureFormatAttribs *Args;
  undefined8 uVar3;
  undefined **Args_1;
  char *pcVar4;
  undefined1 local_128 [8];
  XWindowAttributes XWndAttribs;
  Display *display;
  char *pcStack_90;
  Uint32 wnd;
  undefined1 local_88 [8];
  string _msg_1;
  string _msg;
  TEXTURE_FORMAT ColorFmt;
  DeviceContextGLImpl *pImmediateContextGL_local;
  RenderDeviceGLImpl *pRenderDeviceGL_local;
  SwapChainDesc *SCDesc_local;
  EngineGLCreateInfo *InitAttribs_local;
  IReferenceCounters *pRefCounters_local;
  SwapChainGLImpl *this_local;
  
  SwapChainGLBase<Diligent::ISwapChainGL>::SwapChainGLBase
            (&this->super_SwapChainGLBase<Diligent::ISwapChainGL>,pRefCounters,
             (IRenderDevice *)pRenderDeviceGL,(IDeviceContext *)pImmediateContextGL,SCDesc);
  Args_1 = &PTR_QueryInterface_00593a90;
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  super_ObjectBase<Diligent::ISwapChainGL>.super_RefCountedObject<Diligent::ISwapChainGL>.
  super_ISwapChainGL.super_ISwapChain.super_IObject = (IObject)&PTR_QueryInterface_00593a90;
  if (((this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
       super_SwapChainBase<Diligent::ISwapChainGL>.m_SwapChainDesc.ColorBufferFormat ==
       TEX_FORMAT_RGBA8_UNORM_SRGB) ||
     ((this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
      super_SwapChainBase<Diligent::ISwapChainGL>.m_SwapChainDesc.ColorBufferFormat ==
      TEX_FORMAT_BGRA8_UNORM_SRGB)) {
    pGVar2 = RenderDeviceGLImpl::GetGLCaps(pRenderDeviceGL);
    if ((pGVar2->FramebufferSRGB & 1U) == 0) {
      Format = TEX_FORMAT_BGRA8_UNORM;
      if ((this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
          super_SwapChainBase<Diligent::ISwapChainGL>.m_SwapChainDesc.ColorBufferFormat ==
          TEX_FORMAT_RGBA8_UNORM_SRGB) {
        Format = TEX_FORMAT_RGBA8_UNORM;
      }
      Args = GetTextureFormatAttribs(Format);
      pcVar4 = " because sRGB framebuffers are not enabled.";
      FormatString<char[41],char_const*,char[44]>
                ((string *)((long)&_msg_1.field_2 + 8),
                 (Diligent *)"Changing the swap chain color format to ",(char (*) [41])Args,
                 (char **)" because sRGB framebuffers are not enabled.",(char (*) [44])SCDesc);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        pcVar4 = (char *)0x0;
        (*(code *)puVar1)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      Args_1 = (undefined **)CONCAT62((int6)((ulong)pcVar4 >> 0x10),Format);
      (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
      super_SwapChainBase<Diligent::ISwapChainGL>.m_SwapChainDesc.ColorBufferFormat = Format;
    }
  }
  if (((this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
       super_SwapChainBase<Diligent::ISwapChainGL>.m_DesiredPreTransform !=
       SURFACE_TRANSFORM_OPTIMAL) &&
     ((this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
      super_SwapChainBase<Diligent::ISwapChainGL>.m_DesiredPreTransform !=
      SURFACE_TRANSFORM_IDENTITY)) {
    pcStack_90 = GetSurfaceTransformString
                           ((this->super_SwapChainGLBase<Diligent::ISwapChainGL>).
                            super_SwapChainBase<Diligent::ISwapChainGL>.m_DesiredPreTransform);
    FormatString<char_const*,char[167]>
              ((string *)local_88,(Diligent *)&stack0xffffffffffffff70,
               (char **)
               " is not an allowed pretransform because OpenGL swap chains only support identity transform. Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY."
               ,(char (*) [167])Args_1);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_DesiredPreTransform = SURFACE_TRANSFORM_OPTIMAL;
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_SwapChainDesc.PreTransform = SURFACE_TRANSFORM_IDENTITY;
  XWndAttribs.screen = *(Screen **)(InitAttribs + 0x80);
  XGetWindowAttributes(XWndAttribs.screen,*(undefined4 *)(InitAttribs + 0x78),local_128);
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_SwapChainDesc.Width = XWndAttribs.x;
  (this->super_SwapChainGLBase<Diligent::ISwapChainGL>).super_SwapChainBase<Diligent::ISwapChainGL>.
  m_SwapChainDesc.Height = XWndAttribs.y;
  SwapChainGLBase<Diligent::ISwapChainGL>::CreateDummyBuffers
            (&this->super_SwapChainGLBase<Diligent::ISwapChainGL>,pRenderDeviceGL);
  return;
}

Assistant:

SwapChainGLImpl::SwapChainGLImpl(IReferenceCounters*       pRefCounters,
                                 const EngineGLCreateInfo& InitAttribs,
                                 const SwapChainDesc&      SCDesc,
                                 RenderDeviceGLImpl*       pRenderDeviceGL,
                                 DeviceContextGLImpl*      pImmediateContextGL) :
    // clang-format off
    TSwapChainGLBase
    {
        pRefCounters,
        pRenderDeviceGL,
        pImmediateContextGL,
        SCDesc
    }
// clang-format on
{
    if ((m_SwapChainDesc.ColorBufferFormat == TEX_FORMAT_RGBA8_UNORM_SRGB ||
         m_SwapChainDesc.ColorBufferFormat == TEX_FORMAT_BGRA8_UNORM_SRGB) &&
        !pRenderDeviceGL->GetGLCaps().FramebufferSRGB)
    {
        auto ColorFmt = m_SwapChainDesc.ColorBufferFormat == TEX_FORMAT_RGBA8_UNORM_SRGB ?
            TEX_FORMAT_RGBA8_UNORM :
            TEX_FORMAT_BGRA8_UNORM;
        LOG_WARNING_MESSAGE("Changing the swap chain color format to ", GetTextureFormatAttribs(ColorFmt).Name, " because sRGB framebuffers are not enabled.");
        m_SwapChainDesc.ColorBufferFormat = ColorFmt;
    }

    if (m_DesiredPreTransform != SURFACE_TRANSFORM_OPTIMAL &&
        m_DesiredPreTransform != SURFACE_TRANSFORM_IDENTITY)
    {
        LOG_WARNING_MESSAGE(GetSurfaceTransformString(m_DesiredPreTransform),
                            " is not an allowed pretransform because OpenGL swap chains only support identity transform. "
                            "Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY.");
    }
    m_DesiredPreTransform        = SURFACE_TRANSFORM_OPTIMAL;
    m_SwapChainDesc.PreTransform = SURFACE_TRANSFORM_IDENTITY;

#if PLATFORM_WIN32
    HWND hWnd = reinterpret_cast<HWND>(InitAttribs.Window.hWnd);
    RECT rc;
    GetClientRect(hWnd, &rc);
    m_SwapChainDesc.Width  = rc.right - rc.left;
    m_SwapChainDesc.Height = rc.bottom - rc.top;
#elif PLATFORM_LINUX
    auto wnd     = InitAttribs.Window.WindowId;
    auto display = reinterpret_cast<Display*>(InitAttribs.Window.pDisplay);

    XWindowAttributes XWndAttribs;
    XGetWindowAttributes(display, wnd, &XWndAttribs);

    m_SwapChainDesc.Width  = XWndAttribs.width;
    m_SwapChainDesc.Height = XWndAttribs.height;
#elif PLATFORM_ANDROID
    auto& GLContext        = pRenderDeviceGL->m_GLContext;
    m_SwapChainDesc.Width  = GLContext.GetScreenWidth();
    m_SwapChainDesc.Height = GLContext.GetScreenHeight();
#elif PLATFORM_MACOS
    //Set dummy width and height until resize is called by the app
    m_SwapChainDesc.Width  = 1024;
    m_SwapChainDesc.Height = 768;
#elif PLATFORM_WEB
    int32_t CanvasWidth  = 0;
    int32_t CanvasHeight = 0;
    emscripten_get_canvas_element_size(InitAttribs.Window.pCanvasId, &CanvasWidth, &CanvasHeight);
    m_SwapChainDesc.Width  = static_cast<uint32_t>(CanvasWidth);
    m_SwapChainDesc.Height = static_cast<uint32_t>(CanvasHeight);
#else
#    error Unsupported platform
#endif

    CreateDummyBuffers(pRenderDeviceGL);
}